

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall
c4::yml::Parser::_filter_block_scalar
          (Parser *this,substr s,BlockStyle_e style,BlockChomp_e chomp,size_t indentation)

{
  char cVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  Location LVar15;
  Location LVar16;
  Location LVar17;
  Location LVar18;
  Location LVar19;
  csubstr cVar20;
  csubstr cVar21;
  csubstr cVar22;
  csubstr cVar23;
  csubstr cVar24;
  csubstr cVar25;
  undefined4 uVar26;
  bool bVar27;
  bool bVar28;
  char *pcVar29;
  size_t sVar30;
  char *extraout_RAX;
  size_t sVar31;
  ulong uVar32;
  char *pcVar33;
  undefined8 uVar34;
  char *pcVar35;
  long lVar36;
  long lVar37;
  ro_substr chars;
  csubstr fmt;
  substr dst;
  basic_substring<char> bVar38;
  csubstr cVar39;
  substr sVar40;
  csubstr cVar41;
  basic_substring<char> local_388;
  char *local_370;
  size_t pos;
  uint local_35c;
  char msg [32];
  size_t indentation_local;
  substr s_local;
  csubstr rem_1;
  char *pcStack_2c0;
  size_t local_2b8;
  char *pcStack_298;
  size_t local_290;
  char *pcStack_270;
  size_t local_268;
  char *pcStack_248;
  size_t local_240;
  char *pcStack_220;
  size_t local_218;
  char *pcStack_1f8;
  size_t local_1f0;
  char *pcStack_1d0;
  size_t local_1c8;
  char *pcStack_1a8;
  size_t local_1a0;
  char *pcStack_180;
  size_t local_178;
  char *pcStack_158;
  size_t local_150;
  char *pcStack_130;
  size_t local_128;
  char *pcStack_108;
  size_t local_100;
  char *pcStack_e0;
  size_t local_d8;
  char *pcStack_b8;
  size_t local_b0;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  csubstr rem;
  
  s_local.len = s.len;
  s_local.str = s.str;
  if ((chomp != CHOMP_KEEP) &&
     (chars.len = 3, chars.str = " \n\r", bVar38 = basic_substring<char>::trim(&s_local,chars),
     bVar38.len == 0)) {
    cVar39.len = 0;
    cVar39.str = s_local.str;
    return cVar39;
  }
  local_388.str = s_local.str;
  local_388.len = s_local.len;
  if (style == BLOCK_FOLD) {
    _grow_filter_arena(this,s_local.len + 2);
    pos = 0;
    uVar34 = 0;
    pcVar29 = (char *)basic_substring<char>::first_not_of(&local_388,' ',0);
    local_35c = (uint)CONCAT71((int7)((ulong)uVar34 >> 8),indentation < pcVar29);
    local_370 = (char *)indentation;
    if (pcVar29 < indentation) {
      local_370 = pcVar29;
    }
    bVar27 = false;
    bVar28 = false;
    rem.str = (char *)this;
    rem.len = (size_t)&pos;
    for (; local_370 < local_388.len; local_370 = local_370 + 1) {
      cVar1 = local_388.str[(long)local_370];
      if (cVar1 == '\t') {
LAB_001d340d:
        (this->m_filter_arena).str[pos] = cVar1;
        pos = pos + 1;
      }
      else {
        if (cVar1 == '\r') goto LAB_001d3425;
        if (cVar1 != '\n') {
          bVar27 = true;
          goto LAB_001d340d;
        }
        lVar36 = 0;
        lVar37 = 1;
        sVar31 = 0xffffffffffffffff;
LAB_001d30c9:
        if (local_388.len <= local_370) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
            pcVar3 = (code *)swi(3);
            cVar39 = (csubstr)(*pcVar3)();
            return cVar39;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x14c3,"i >= 0 && i < len");
        }
        pcVar29 = local_370;
        if (local_388.str[(long)local_370] != '\n') {
LAB_001d421a:
          local_370 = pcVar29;
          lVar37 = sVar31 + 1;
          while (bVar27 = lVar37 != 0, lVar37 = lVar37 + -1, bVar27) {
            (this->m_filter_arena).str[pos] = '\n';
            pos = pos + 1;
          }
          bVar28 = true;
          break;
        }
        pcVar29 = local_370 + 1;
        if (local_388.len < pcVar29) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
            pcVar3 = (code *)swi(3);
            cVar39 = (csubstr)(*pcVar3)();
            return cVar39;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<char>::basic_substring
                  ((basic_substring<char> *)msg,local_388.str + (long)pcVar29,
                   local_388.len - (long)pcVar29);
        sVar31 = sVar31 + 1;
        rem_1.len = CONCAT35(msg._13_3_,msg._8_5_);
        rem_1.str = (char *)msg._0_8_;
        sVar30 = basic_substring<const_char>::first_not_of(&rem_1,' ',0);
        uVar26 = msg._26_4_;
        if (sVar30 != 0xffffffffffffffff) {
          pcVar29 = local_370 + sVar30;
          do {
            pcVar29 = pcVar29 + 1;
            if (local_388.len <= pcVar29) break;
          } while (local_388.str[(long)pcVar29] == '\r');
          if (rem_1.len <= sVar30) {
            builtin_strncpy(msg + 0x10,"irst < rem.len)",0x10);
            builtin_strncpy(msg,"check failed: (f",0x10);
            if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
              pcVar3 = (code *)swi(3);
              cVar39 = (csubstr)(*pcVar3)();
              return cVar39;
            }
            p_Var2 = (this->m_stack).m_callbacks.m_error;
            cVar39 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
            local_150 = cVar39.len;
            pcStack_158 = cVar39.str;
            LVar4.super_LineCol.col = 0;
            LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7e33) << 0x40,0);
            LVar4.super_LineCol.line = SUB168(ZEXT816(0x7e33) << 0x40,8);
            LVar4.name.str = pcStack_158;
            LVar4.name.len = local_150;
            (*p_Var2)(msg,0x20,LVar4,(this->m_stack).m_callbacks.m_user_data);
          }
          if (local_388.len <= local_370 + sVar30 + 1) {
            builtin_strncpy(msg + 0x10,"+1+first < r.len",0x10);
            builtin_strncpy(msg,"check failed: (i",0x10);
            if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
              pcVar3 = (code *)swi(3);
              cVar39 = (csubstr)(*pcVar3)();
              return cVar39;
            }
            p_Var2 = (this->m_stack).m_callbacks.m_error;
            cVar39 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
            local_178 = cVar39.len;
            pcStack_180 = cVar39.str;
            LVar5.super_LineCol.col = 0;
            LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7e34) << 0x40,0);
            LVar5.super_LineCol.line = SUB168(ZEXT816(0x7e34) << 0x40,8);
            LVar5.name.str = pcStack_180;
            LVar5.name.len = local_178;
            (*p_Var2)(msg,0x22,LVar5,(this->m_stack).m_callbacks.m_user_data);
          }
          if (sVar30 < indentation) {
            local_370 = local_370 + sVar30;
          }
          else {
            local_370 = local_370 + indentation;
            if (indentation < sVar30) goto LAB_001d3536;
          }
          if (local_388.len <= pcVar29) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
              pcVar3 = (code *)swi(3);
              cVar39 = (csubstr)(*pcVar3)();
              return cVar39;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x14c3,"i >= 0 && i < len");
          }
          if (local_388.str[(long)pcVar29] == '\n') goto code_r0x001d3345;
          goto LAB_001d3536;
        }
        if (local_388.len < local_370 + 1) {
          builtin_strncpy(msg,"check failed: (i+1 <= r.len)",0x1d);
          msg[0x1d] = SUB41(uVar26,3);
          if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
            pcVar3 = (code *)swi(3);
            cVar39 = (csubstr)(*pcVar3)();
            return cVar39;
          }
          p_Var2 = (this->m_stack).m_callbacks.m_error;
          cVar39 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_1a0 = cVar39.len;
          pcStack_1a8 = cVar39.str;
          LVar6.super_LineCol.col = 0;
          LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7e4f) << 0x40,0);
          LVar6.super_LineCol.line = SUB168(ZEXT816(0x7e4f) << 0x40,8);
          LVar6.name.str = pcStack_1a8;
          LVar6.name.len = local_1a0;
          (*p_Var2)(msg,0x1d,LVar6,(this->m_stack).m_callbacks.m_user_data);
        }
        uVar26 = msg._26_4_;
        if (rem_1.len == 0) {
          pcVar29 = local_370;
          if (local_370 + 1 != (char *)local_388.len) {
            builtin_strncpy(msg,"check failed: (i+1 == r.len)",0x1d);
            msg[0x1d] = SUB41(uVar26,3);
            if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
              pcVar3 = (code *)swi(3);
              cVar39 = (csubstr)(*pcVar3)();
              return cVar39;
            }
            p_Var2 = (this->m_stack).m_callbacks.m_error;
            cVar39 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
            local_1c8 = cVar39.len;
            pcStack_1d0 = cVar39.str;
            LVar14.super_LineCol.col = 0;
            LVar14.super_LineCol.offset = SUB168(ZEXT816(0x7e68) << 0x40,0);
            LVar14.super_LineCol.line = SUB168(ZEXT816(0x7e68) << 0x40,8);
            LVar14.name.str = pcStack_1d0;
            LVar14.name.len = local_1c8;
            (*p_Var2)(msg,0x1d,LVar14,(this->m_stack).m_callbacks.m_user_data);
            uVar26 = msg._26_4_;
            pcVar29 = local_370;
            if (rem_1.len != 0) {
              builtin_strncpy(msg,"check failed: (rem.len == 0)",0x1d);
              msg[0x1d] = SUB41(uVar26,3);
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar39 = (csubstr)(*pcVar3)();
                return cVar39;
              }
              p_Var2 = (this->m_stack).m_callbacks.m_error;
              cVar39 = to_csubstr(
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 );
              local_1f0 = cVar39.len;
              pcStack_1f8 = cVar39.str;
              LVar15.super_LineCol.col = 0;
              LVar15.super_LineCol.offset = SUB168(ZEXT816(0x7e69) << 0x40,0);
              LVar15.super_LineCol.line = SUB168(ZEXT816(0x7e69) << 0x40,8);
              LVar15.name.str = pcStack_1f8;
              LVar15.name.len = local_1f0;
              (*p_Var2)(msg,0x1d,LVar15,(this->m_stack).m_callbacks.m_user_data);
              pcVar29 = local_370;
            }
          }
          goto LAB_001d421a;
        }
        if (rem_1.len < indentation) {
          pcVar29 = local_370 + rem_1.len;
          goto LAB_001d421a;
        }
        pcVar29 = local_370 + indentation;
        if (rem_1.len <= indentation) goto LAB_001d421a;
        pcVar29 = local_370 + rem_1.len + 1;
        local_370 = local_370 + indentation;
LAB_001d3536:
        pcVar35 = (char *)local_388.len;
        if (local_388.len < pcVar29) {
          pcVar35 = pcVar29;
        }
        for (; (pcVar33 = pcVar35, pcVar29 < local_388.len &&
               (pcVar33 = pcVar29, local_388.str[(long)pcVar29] == '\t')); pcVar29 = pcVar29 + 1) {
        }
        if (local_388.len < pcVar33) {
          builtin_strncpy(msg + 0x10,"irst_non_whitesp",0x10);
          builtin_strncpy(msg,"check failed: (f",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
            pcVar3 = (code *)swi(3);
            cVar39 = (csubstr)(*pcVar3)();
            return cVar39;
          }
          p_Var2 = (this->m_stack).m_callbacks.m_error;
          cVar39 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_218 = cVar39.len;
          pcStack_220 = cVar39.str;
          LVar7.super_LineCol.col = 0;
          LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7e7b) << 0x40,0);
          LVar7.super_LineCol.line = SUB168(ZEXT816(0x7e7b) << 0x40,8);
          LVar7.name.str = pcStack_220;
          LVar7.name.len = local_218;
          (*p_Var2)(msg,0x2e,LVar7,(this->m_stack).m_callbacks.m_user_data);
        }
        sVar30 = basic_substring<char>::last_of(&local_388,'\n',(size_t)pcVar33);
        if (pcVar33 < (char *)(sVar30 + 1)) {
          builtin_strncpy(msg + 0x10,"irst_non_whitesp",0x10);
          builtin_strncpy(msg,"check failed: (f",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
            pcVar3 = (code *)swi(3);
            cVar39 = (csubstr)(*pcVar3)();
            return cVar39;
          }
          p_Var2 = (this->m_stack).m_callbacks.m_error;
          cVar39 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_240 = cVar39.len;
          pcStack_248 = cVar39.str;
          LVar8.super_LineCol.col = 0;
          LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7e7f) << 0x40,0);
          LVar8.super_LineCol.line = SUB168(ZEXT816(0x7e7f) << 0x40,8);
          LVar8.name.str = pcStack_248;
          LVar8.name.len = local_240;
          (*p_Var2)(msg,0x36,LVar8,(this->m_stack).m_callbacks.m_user_data);
        }
        pcVar29 = pcVar33 + ~sVar30;
        if (pcVar29 < indentation) {
          builtin_strncpy(msg + 0x10,"his_indentation ",0x10);
          builtin_strncpy(msg,"check failed: (t",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
            pcVar3 = (code *)swi(3);
            cVar39 = (csubstr)(*pcVar3)();
            return cVar39;
          }
          p_Var2 = (this->m_stack).m_callbacks.m_error;
          cVar39 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_268 = cVar39.len;
          pcStack_270 = cVar39.str;
          LVar9.super_LineCol.col = 0;
          LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7e80) << 0x40,0);
          LVar9.super_LineCol.line = SUB168(ZEXT816(0x7e80) << 0x40,8);
          LVar9.name.str = pcStack_270;
          LVar9.name.len = local_268;
          (*p_Var2)(msg,0x30,LVar9,(this->m_stack).m_callbacks.m_user_data);
        }
        if (bVar27) {
          if (pcVar29 == (char *)indentation) {
            if ((local_35c & 1) == 0) {
              if (sVar31 == 0) {
                (this->m_filter_arena).str[pos] = ' ';
                pos = pos + 1;
              }
              else {
                while (bVar27 = lVar36 != 0, lVar36 = lVar36 + -1, bVar27) {
                  (this->m_filter_arena).str[pos] = '\n';
                  pos = pos + 1;
                }
              }
              local_370 = pcVar33 + -1;
            }
            else {
              _filter_block_scalar::anon_class_40_5_c71bfa08::operator()
                        ((anon_class_40_5_c71bfa08 *)&rem,sVar31,sVar30,(size_t)pcVar33);
            }
            bVar28 = true;
            local_35c = 0;
            bVar27 = true;
          }
          else {
            if (pcVar29 <= indentation) {
              builtin_strncpy(msg + 0x10,"his_indentation ",0x10);
              builtin_strncpy(msg,"check failed: (t",0x10);
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar39 = (csubstr)(*pcVar3)();
                return cVar39;
              }
              p_Var2 = (this->m_stack).m_callbacks.m_error;
              cVar39 = to_csubstr(
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 );
              local_290 = cVar39.len;
              pcStack_298 = cVar39.str;
              LVar10.super_LineCol.col = 0;
              LVar10.super_LineCol.offset = SUB168(ZEXT816(0x7eb1) << 0x40,0);
              LVar10.super_LineCol.line = SUB168(ZEXT816(0x7eb1) << 0x40,8);
              LVar10.name.str = pcStack_298;
              LVar10.name.len = local_290;
              (*p_Var2)(msg,0x2f,LVar10,(this->m_stack).m_callbacks.m_user_data);
            }
            _filter_block_scalar::anon_class_40_5_c71bfa08::operator()
                      ((anon_class_40_5_c71bfa08 *)&rem,sVar31,sVar30,(size_t)pcVar33);
            bVar27 = true;
            pcVar29 = extraout_RAX;
LAB_001d3964:
            bVar28 = true;
            local_35c = (uint)CONCAT71((int7)((ulong)pcVar29 >> 8),1);
          }
        }
        else {
          while (bVar27 = lVar37 != 0, lVar37 = lVar37 + -1, bVar27) {
            (this->m_filter_arena).str[pos] = '\n';
            pos = pos + 1;
          }
          if (indentation < pcVar29) {
            pcVar29 = (char *)(indentation + sVar30);
            bVar27 = false;
            local_370 = pcVar29;
            goto LAB_001d3964;
          }
          local_370 = pcVar33 + -1;
          bVar28 = true;
          bVar27 = false;
        }
      }
LAB_001d3425:
    }
    uVar32 = (this->m_filter_arena).len;
    if (uVar32 < pos) {
      builtin_strncpy(msg + 0x10,"os <= m_filter_a",0x10);
      builtin_strncpy(msg,"check failed: (p",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
        pcVar3 = (code *)swi(3);
        cVar39 = (csubstr)(*pcVar3)();
        return cVar39;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar39 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_2b8 = cVar39.len;
      pcStack_2c0 = cVar39.str;
      LVar19.super_LineCol.col = 0;
      LVar19.super_LineCol.offset = SUB168(ZEXT816(0x7ebd) << 0x40,0);
      LVar19.super_LineCol.line = SUB168(ZEXT816(0x7ebd) << 0x40,8);
      LVar19.name.str = pcStack_2c0;
      LVar19.name.len = local_2b8;
      (*p_Var2)(msg,0x2a,LVar19,(this->m_stack).m_callbacks.m_user_data);
      uVar32 = (this->m_filter_arena).len;
    }
    sVar40.len = uVar32;
    sVar40.str = (this->m_filter_arena).str;
    bVar27 = _apply_chomp(this,sVar40,&pos,chomp);
    cVar22.len = local_388.len;
    cVar22.str = local_388.str;
    pcVar29 = (char *)pos;
    if ((local_388.len <= pos) && (!bVar28 && !bVar27)) {
      return cVar22;
    }
  }
  else {
    if (style != BLOCK_LITERAL) {
      bVar27 = is_debugger_attached();
      if ((bVar27) && (bVar27 = is_debugger_attached(), bVar27)) {
        pcVar3 = (code *)swi(3);
        cVar39 = (csubstr)(*pcVar3)();
        return cVar39;
      }
      fmt.len = 0x1a;
      fmt.str = "ERROR: unknown block style";
      _err<>(this,fmt);
      cVar21.len = local_388.len;
      cVar21.str = local_388.str;
      return cVar21;
    }
    pcVar29 = (char *)basic_substring<char>::first_not_of(&local_388,' ',0);
    if (pcVar29 == (char *)0xffffffffffffffff) {
      cVar24.len = 0;
      cVar24.str = local_388.str;
      cVar23.len = 0;
      cVar23.str = local_388.str;
      if (chomp != CHOMP_KEEP) {
        return cVar23;
      }
      if ((char *)local_388.len == (char *)0x0) {
        return cVar24;
      }
      *local_388.str = '\n';
      if ((char *)local_388.len != (char *)0x0) {
        basic_substring<char>::basic_substring((basic_substring<char> *)msg,local_388.str,1);
        cVar25.len._5_1_ = msg[0xd];
        cVar25.len._6_1_ = msg[0xe];
        cVar25.len._7_1_ = msg[0xf];
        cVar25.len._0_1_ = msg[8];
        cVar25.len._1_1_ = msg[9];
        cVar25.len._2_1_ = msg[10];
        cVar25.len._3_1_ = msg[0xb];
        cVar25.len._4_1_ = msg[0xc];
        cVar25.str = (char *)msg._0_8_;
        return cVar25;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
        pcVar3 = (code *)swi(3);
        cVar39 = (csubstr)(*pcVar3)();
        return cVar39;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
    if (indentation < pcVar29) {
      if (local_388.len < indentation) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
          pcVar3 = (code *)swi(3);
          cVar39 = (csubstr)(*pcVar3)();
          return cVar39;
        }
        handle_error(0x1e7ac6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)msg,local_388.str + indentation,
                 local_388.len - indentation);
    }
    else {
      if (local_388.len < pcVar29) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
          pcVar3 = (code *)swi(3);
          cVar39 = (csubstr)(*pcVar3)();
          return cVar39;
        }
        handle_error(0x1e7ac6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)msg,local_388.str + (long)pcVar29,
                 local_388.len - (long)pcVar29);
    }
    local_388.len = CONCAT35(msg._13_3_,msg._8_5_);
    local_388.str = (char *)msg._0_8_;
    _grow_filter_arena(this,s_local.len + 2);
    pcVar29 = (char *)0x0;
    for (pcVar35 = (char *)0x0; rem_1.str = pcVar29, pcVar35 < local_388.len; pcVar35 = pcVar35 + 1)
    {
      cVar1 = local_388.str[(long)pcVar35];
      pcVar33 = pcVar29;
      if (cVar1 != '\r') {
        pcVar33 = pcVar29 + 1;
        pcVar29[(long)(this->m_filter_arena).str] = cVar1;
        if (cVar1 == '\n') {
          if (local_388.len <= pcVar35) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
              pcVar3 = (code *)swi(3);
              cVar39 = (csubstr)(*pcVar3)();
              return cVar39;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1533,"first >= 0 && first <= len");
          }
          pcVar29 = pcVar35 + 1;
          basic_substring<char>::basic_substring
                    ((basic_substring<char> *)msg,local_388.str + (long)pcVar29,
                     local_388.len - (long)pcVar29);
          rem.len = CONCAT35(msg._13_3_,msg._8_5_);
          rem.str = (char *)msg._0_8_;
          sVar31 = basic_substring<const_char>::first_not_of(&rem,' ',0);
          uVar26 = msg._26_4_;
          if (sVar31 == 0xffffffffffffffff) {
            if (local_388.len <= pcVar35) {
              builtin_strncpy(msg,"check failed: (i+1 <= r.len)",0x1d);
              msg[0x1d] = SUB41(uVar26,3);
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar39 = (csubstr)(*pcVar3)();
                return cVar39;
              }
              p_Var2 = (this->m_stack).m_callbacks.m_error;
              cVar39 = to_csubstr(
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 );
              local_b0 = cVar39.len;
              pcStack_b8 = cVar39.str;
              LVar13.super_LineCol.col = 0;
              LVar13.super_LineCol.offset = SUB168(ZEXT816(0x7ddc) << 0x40,0);
              LVar13.super_LineCol.line = SUB168(ZEXT816(0x7ddc) << 0x40,8);
              LVar13.name.str = pcStack_b8;
              LVar13.name.len = local_b0;
              (*p_Var2)(msg,0x1d,LVar13,(this->m_stack).m_callbacks.m_user_data);
            }
            if (rem.len == 0) {
              if (pcVar29 == (char *)local_388.len) {
                if (chomp != CHOMP_STRIP) {
                  rem_1.str = pcVar33;
                }
                break;
              }
            }
            else {
              if (rem.len < indentation) break;
              pcVar35 = pcVar35 + indentation;
            }
          }
          else {
            if (rem.len <= sVar31) {
              builtin_strncpy(msg + 0x10,"irst < rem.len)",0x10);
              builtin_strncpy(msg,"check failed: (f",0x10);
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar39 = (csubstr)(*pcVar3)();
                return cVar39;
              }
              p_Var2 = (this->m_stack).m_callbacks.m_error;
              cVar39 = to_csubstr(
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 );
              local_60 = cVar39.len;
              pcStack_68 = cVar39.str;
              LVar11.super_LineCol.col = 0;
              LVar11.super_LineCol.offset = SUB168(ZEXT816(0x7dcc) << 0x40,0);
              LVar11.super_LineCol.line = SUB168(ZEXT816(0x7dcc) << 0x40,8);
              LVar11.name.str = pcStack_68;
              LVar11.name.len = local_60;
              (*p_Var2)(msg,0x20,LVar11,(this->m_stack).m_callbacks.m_user_data);
            }
            if (local_388.len <= pcVar29 + sVar31) {
              builtin_strncpy(msg + 0x10,"+1+first < r.len",0x10);
              builtin_strncpy(msg,"check failed: (i",0x10);
              if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
                pcVar3 = (code *)swi(3);
                cVar39 = (csubstr)(*pcVar3)();
                return cVar39;
              }
              p_Var2 = (this->m_stack).m_callbacks.m_error;
              cVar39 = to_csubstr(
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 );
              local_88 = cVar39.len;
              pcStack_90 = cVar39.str;
              LVar12.super_LineCol.col = 0;
              LVar12.super_LineCol.offset = SUB168(ZEXT816(0x7dcd) << 0x40,0);
              LVar12.super_LineCol.line = SUB168(ZEXT816(0x7dcd) << 0x40,8);
              LVar12.name.str = pcStack_90;
              LVar12.name.len = local_88;
              (*p_Var2)(msg,0x22,LVar12,(this->m_stack).m_callbacks.m_user_data);
            }
            if (sVar31 < indentation) {
              pcVar35 = pcVar35 + sVar31;
            }
            else {
              pcVar35 = pcVar35 + indentation;
            }
          }
        }
      }
      pcVar29 = pcVar33;
    }
    uVar26 = msg._26_4_;
    if (s_local.len < rem_1.str) {
      builtin_strncpy(msg,"check failed: (s.len >= pos)",0x1d);
      msg[0x1d] = SUB41(uVar26,3);
      if ((((byte)s_error_flags & 1) != 0) && (bVar27 = is_debugger_attached(), bVar27)) {
        pcVar3 = (code *)swi(3);
        cVar39 = (csubstr)(*pcVar3)();
        return cVar39;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar39 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_d8 = cVar39.len;
      pcStack_e0 = cVar39.str;
      LVar16.super_LineCol.col = 0;
      LVar16.super_LineCol.offset = SUB168(ZEXT816(0x7df6) << 0x40,0);
      LVar16.super_LineCol.line = SUB168(ZEXT816(0x7df6) << 0x40,8);
      LVar16.name.str = pcStack_e0;
      LVar16.name.len = local_d8;
      (*p_Var2)(msg,0x1d,LVar16,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar27 = _apply_chomp(this,this->m_filter_arena,(size_t *)&rem_1,chomp);
    pcVar29 = rem_1.str;
    if ((char *)(this->m_filter_arena).len < rem_1.str) {
      builtin_strncpy(msg + 0x10,"os <= m_filter_a",0x10);
      builtin_strncpy(msg,"check failed: (p",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
        pcVar3 = (code *)swi(3);
        cVar39 = (csubstr)(*pcVar3)();
        return cVar39;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar39 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_100 = cVar39.len;
      pcStack_108 = cVar39.str;
      LVar17.super_LineCol.col = 0;
      LVar17.super_LineCol.offset = SUB168(ZEXT816(0x7df9) << 0x40,0);
      LVar17.super_LineCol.line = SUB168(ZEXT816(0x7df9) << 0x40,8);
      LVar17.name.str = pcStack_108;
      LVar17.name.len = local_100;
      (*p_Var2)(msg,0x2a,LVar17,(this->m_stack).m_callbacks.m_user_data);
    }
    uVar26 = msg._26_4_;
    if (s_local.len < pcVar29) {
      builtin_strncpy(msg,"check failed: (pos <= s.len)",0x1d);
      msg[0x1d] = SUB41(uVar26,3);
      if ((((byte)s_error_flags & 1) != 0) && (bVar28 = is_debugger_attached(), bVar28)) {
        pcVar3 = (code *)swi(3);
        cVar39 = (csubstr)(*pcVar3)();
        return cVar39;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar39 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_128 = cVar39.len;
      pcStack_130 = cVar39.str;
      LVar18.super_LineCol.col = 0;
      LVar18.super_LineCol.offset = SUB168(ZEXT816(0x7dfa) << 0x40,0);
      LVar18.super_LineCol.line = SUB168(ZEXT816(0x7dfa) << 0x40,8);
      LVar18.name.str = pcStack_130;
      LVar18.name.len = local_128;
      (*p_Var2)(msg,0x1d,LVar18,(this->m_stack).m_callbacks.m_user_data);
    }
    cVar20.len = local_388.len;
    cVar20.str = local_388.str;
    if ((~bVar27 & local_388.len <= pcVar29) != 0) {
      return cVar20;
    }
  }
  dst.len = s_local.len;
  dst.str = s_local.str;
  sVar40 = _finish_filter_arena(this,dst,(size_t)pcVar29);
  cVar41.str = sVar40.str;
  cVar41.len = sVar40.len;
  return cVar41;
code_r0x001d3345:
  lVar37 = lVar37 + 1;
  lVar36 = lVar36 + 1;
  local_370 = pcVar29;
  goto LAB_001d30c9;
}

Assistant:

csubstr Parser::_filter_block_scalar(substr s, BlockStyle_e style, BlockChomp_e chomp, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfbl(fmt, ...) _c4dbgpf("filt_block" fmt, __VA_ARGS__)
    #else
    #define _c4dbgfbl(...)
    #endif

    _c4dbgfbl(": indentation={} before=[{}]~~~{}~~~", indentation, s.len, s);

    if(chomp != CHOMP_KEEP && s.trim(" \n\r").len == 0u)
    {
        _c4dbgp("filt_block: empty scalar");
        return s.first(0);
    }

    substr r = s;

    switch(style)
    {
    case BLOCK_LITERAL:
        {
            _c4dbgp("filt_block: style=literal");
            // trim leading whitespace up to indentation
            {
                size_t numws = r.first_not_of(' ');
                if(numws != npos)
                {
                    if(numws > indentation)
                        r = r.sub(indentation);
                    else
                        r = r.sub(numws);
                    _c4dbgfbl(": after triml=[{}]~~~{}~~~", r.len, r);
                }
                else
                {
                    if(chomp != CHOMP_KEEP || r.len == 0)
                    {
                        _c4dbgfbl(": all spaces {}, return empty", r.len);
                        return r.first(0);
                    }
                    else
                    {
                        r[0] = '\n';
                        return r.first(1);
                    }
                }
            }
            _grow_filter_arena(s.len + 2u);  // use s.len! because we may need to add a newline at the end, so the leading indentation will allow space for that newline
            size_t pos = 0; // the filtered size
            for(size_t i = 0; i < r.len; ++i)
            {
                const char curr = r.str[i];
                _c4dbgfbl("[{}]='{}'  pos={}", i, _c4prc(curr), pos);
                if(curr == '\r')
                    continue;
                m_filter_arena.str[pos++] = curr;
                if(curr == '\n')
                {
                    _c4dbgfbl("[{}]: found newline", i);
                    // skip indentation on the next line
                    csubstr rem = r.sub(i+1);
                    size_t first = rem.first_not_of(' ');
                    if(first != npos)
                    {
                        _RYML_CB_ASSERT(m_stack.m_callbacks, first < rem.len);
                        _RYML_CB_ASSERT(m_stack.m_callbacks, i+1+first < r.len);
                        _c4dbgfbl("[{}]: {} spaces follow before next nonws character @ [{}]='{}'", i, first, i+1+first, rem.str[first]);
                        if(first < indentation)
                        {
                            _c4dbgfbl("[{}]: skip {}<{} spaces from indentation", i, first, indentation);
                            i += first;
                        }
                        else
                        {
                            _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                            i += indentation;
                        }
                    }
                    else
                    {
                        _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 <= r.len);
                        first = rem.len;
                        _c4dbgfbl("[{}]: {} spaces to the end", i, first);
                        if(first)
                        {
                            if(first < indentation)
                            {
                                _c4dbgfbl("[{}]: skip everything", i);
                                --pos;
                                break;
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                i += indentation;
                            }
                        }
                        else if(i+1 == r.len)
                        {
                            if(chomp == CHOMP_STRIP)
                                --pos;
                            break;
                        }
                    }
                }
            }
            _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= pos);
            _c4dbgfbl(": #filteredchars={} after=~~~{}~~~", s.len - r.len, r);
            bool changed = _apply_chomp(m_filter_arena, &pos, chomp);
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= s.len);
            if(pos < r.len || changed)
            {
                r = _finish_filter_arena(s, pos); // write into s
            }
            break;
        }
    case BLOCK_FOLD:
        {
            _c4dbgp("filt_block: style=fold");
            _grow_filter_arena(r.len + 2);
            size_t pos = 0; // the filtered size
            bool filtered_chars = false;
            bool started = false;
            bool is_indented = false;
            size_t i = r.first_not_of(' ');
            _c4dbgfbl(": first non space at {}", i);
            if(i > indentation)
            {
                is_indented = true;
                i = indentation;
            }
            _c4dbgfbl(": start folding at {}, is_indented={}", i, (int)is_indented);
            auto on_change_indentation = [&](size_t numnl_following, size_t last_newl, size_t first_non_whitespace){
                _c4dbgfbl("[{}]: add 1+{} newlines", i, numnl_following);
                for(size_t j = 0; j < 1 + numnl_following; ++j)
                    m_filter_arena.str[pos++] = '\n';
                for(i = last_newl + 1 + indentation; i < first_non_whitespace; ++i)
                {
                    if(r.str[i] == '\r')
                        continue;
                    _c4dbgfbl("[{}]: add '{}'", i, _c4prc(r.str[i]));
                    m_filter_arena.str[pos++] = r.str[i];
                }
                --i;
            };
            for( ; i < r.len; ++i)
            {
                const char curr = r.str[i];
                _c4dbgfbl("[{}]='{}'", i, _c4prc(curr));
                if(curr == '\n')
                {
                    filtered_chars = true;
                    // skip indentation on the next line, and advance over the next non-indented blank lines as well
                    size_t first_non_whitespace;
                    size_t numnl_following = (size_t)-1;
                    while(r[i] == '\n')
                    {
                        ++numnl_following;
                        csubstr rem = r.sub(i+1);
                        size_t first = rem.first_not_of(' ');
                        _c4dbgfbl("[{}]: found newline. first={} rem.len={}", i, first, rem.len);
                        if(first != npos)
                        {
                            first_non_whitespace = first + i+1;
                            while(first_non_whitespace < r.len && r[first_non_whitespace] == '\r')
                                ++first_non_whitespace;
                            _RYML_CB_ASSERT(m_stack.m_callbacks, first < rem.len);
                            _RYML_CB_ASSERT(m_stack.m_callbacks, i+1+first < r.len);
                            _c4dbgfbl("[{}]: {} spaces follow before next nonws character @ [{}]='{}'", i, first, i+1+first, _c4prc(rem.str[first]));
                            if(first < indentation)
                            {
                                _c4dbgfbl("[{}]: skip {}<{} spaces from indentation", i, first, indentation);
                                i += first;
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                i += indentation;
                                if(first > indentation)
                                {
                                    _c4dbgfbl("[{}]: {} further indented than {}, stop newlining", i, first, indentation);
                                    goto finished_counting_newlines;
                                }
                            }
                            // prepare the next while loop iteration
                            // by setting i at the next newline after
                            // an empty line
                            if(r[first_non_whitespace] == '\n')
                                i = first_non_whitespace;
                            else
                                goto finished_counting_newlines;
                        }
                        else
                        {
                            _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 <= r.len);
                            first = rem.len;
                            first_non_whitespace = first + i+1;
                            if(first)
                            {
                                _c4dbgfbl("[{}]: {} spaces to the end", i, first);
                                if(first < indentation)
                                {
                                    _c4dbgfbl("[{}]: skip everything", i);
                                    i += first;
                                }
                                else
                                {
                                    _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                    i += indentation;
                                    if(first > indentation)
                                    {
                                        _c4dbgfbl("[{}]: {} spaces missing. not done yet", i, indentation - first);
                                        goto finished_counting_newlines;
                                    }
                                }
                            }
                            else // if(i+1 == r.len)
                            {
                                _c4dbgfbl("[{}]: it's the final newline", i);
                                _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 == r.len);
                                _RYML_CB_ASSERT(m_stack.m_callbacks, rem.len == 0);
                            }
                            goto end_of_scalar;
                        }
                    }
                end_of_scalar:
                    // Write all the trailing newlines. Since we're
                    // at the end no folding is needed, so write every
                    // newline (add 1).
                    _c4dbgfbl("[{}]: add {} trailing newlines", i, 1+numnl_following);
                    for(size_t j = 0; j < 1 + numnl_following; ++j)
                        m_filter_arena.str[pos++] = '\n';
                    break;
                finished_counting_newlines:
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={}", i, numnl_following, first_non_whitespace);
                    while(first_non_whitespace < r.len && r[first_non_whitespace] == '\t')
                        ++first_non_whitespace;
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={}", i, numnl_following, first_non_whitespace);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, first_non_whitespace <= r.len);
                    size_t last_newl = r.last_of('\n', first_non_whitespace);
                    size_t this_indentation = first_non_whitespace - last_newl - 1;
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={} lastnewl={} this_indentation={} vs indentation={}", i, numnl_following, first_non_whitespace, last_newl, this_indentation, indentation);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, first_non_whitespace >= last_newl + 1);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, this_indentation >= indentation);
                    if(!started)
                    {
                        _c4dbgfbl("[{}]: #newlines={}. write all leading newlines", i, numnl_following);
                        for(size_t j = 0; j < 1 + numnl_following; ++j)
                            m_filter_arena.str[pos++] = '\n';
                        if(this_indentation > indentation)
                        {
                            is_indented = true;
                            _c4dbgfbl("[{}]: advance ->{}", i, last_newl + indentation);
                            i = last_newl + indentation;
                        }
                        else
                        {
                            i = first_non_whitespace - 1;
                            _c4dbgfbl("[{}]: advance ->{}", i, first_non_whitespace);
                        }
                    }
                    else if(this_indentation == indentation)
                    {
                        _c4dbgfbl("[{}]: same indentation", i);
                        if(!is_indented)
                        {
                            if(numnl_following == 0)
                            {
                                _c4dbgfbl("[{}]: fold!", i);
                                m_filter_arena.str[pos++] = ' ';
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: add {} newlines", i, 1 + numnl_following);
                                for(size_t j = 0; j < numnl_following; ++j)
                                    m_filter_arena.str[pos++] = '\n';
                            }
                            i = first_non_whitespace - 1;
                            _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                        }
                        else
                        {
                            _c4dbgfbl("[{}]: back to ref indentation", i);
                            is_indented = false;
                            on_change_indentation(numnl_following, last_newl, first_non_whitespace);
                            _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                        }
                    }
                    else
                    {
                        _c4dbgfbl("[{}]: increased indentation.", i);
                        is_indented = true;
                        _RYML_CB_ASSERT(m_stack.m_callbacks, this_indentation > indentation);
                        on_change_indentation(numnl_following, last_newl, first_non_whitespace);
                        _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                    }
                }
                else if(curr != '\r')
                {
                    if(curr != '\t')
                        started = true;
                    m_filter_arena.str[pos++] = curr;
                }
            }
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
            _c4dbgfbl(": #filteredchars={} after=[{}]~~~{}~~~", (int)s.len - (int)pos, pos, m_filter_arena.first(pos));
            bool changed = _apply_chomp(m_filter_arena, &pos, chomp);
            if(pos < r.len || filtered_chars || changed)
            {
                r = _finish_filter_arena(s, pos); // write into s
            }
        }
        break;
    default:
        _c4err("unknown block style");
    }

    _c4dbgfbl(": final=[{}]~~~{}~~~", r.len, r);

    #undef _c4dbgfbl

    return r;
}